

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmpp_obj_test.c
# Opt level: O2

int main(void)

{
  undefined8 uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  
  _mpp_log_l(4,"kmpp_obj_test","start\n",0);
  iVar2 = -1;
  lVar4 = 0x10;
  do {
    if (lVar4 == 0x58) {
LAB_001012d3:
      pcVar3 = "failed";
      if (iVar2 == 0) {
        pcVar3 = "success";
      }
      _mpp_log_l(4,"kmpp_obj_test","done %s \n",0,pcVar3);
      return iVar2;
    }
    uVar1 = *(undefined8 *)((long)&__frame_dummy_init_array_entry + lVar4);
    iVar2 = (**(code **)((long)&obj_tests[0].name + lVar4))(uVar1,0);
    if (iVar2 != 0) {
      _mpp_log_l(4,"kmpp_obj_test","test %-16s failed ret %d\n",0,uVar1,iVar2);
      goto LAB_001012d3;
    }
    iVar2 = 0;
    _mpp_log_l(4,"kmpp_obj_test","test %-16s success\n",0,uVar1);
    lVar4 = lVar4 + 0x18;
  } while( true );
}

Assistant:

int main()
{
    MPP_RET ret = MPP_NOK;
    rk_u32 i;

    mpp_log("start\n");

    for (i = 0; i < MPP_ARRAY_ELEMS(obj_tests); i++) {
        const char *name = obj_tests[i].name;
        rk_u32 flag = obj_tests[i].flag;

        ret = obj_tests[i].func(name, flag);
        if (ret) {
            mpp_log("test %-16s failed ret %d\n", name, ret);
            goto done;
        }
        mpp_log("test %-16s success\n", name);
    }

done:
    mpp_log("done %s \n", ret ? "failed" : "success");

    return ret;
}